

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_type_index.hpp
# Opt level: O2

bool __thiscall boost::typeindex::stl_type_index::equal(stl_type_index *this,stl_type_index *rhs)

{
  int iVar1;
  char *__s2;
  char *__s1;
  
  __s1 = *(char **)(this->data_ + 8) + (**(char **)(this->data_ + 8) == '*');
  __s2 = *(char **)(rhs->data_ + 8) + (**(char **)(rhs->data_ + 8) == '*');
  if (__s1 != __s2) {
    iVar1 = strcmp(__s1,__s2);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

inline const char* stl_type_index::raw_name() const BOOST_NOEXCEPT {
#ifdef _MSC_VER
    return data_->raw_name();
#else
    return data_->name();
#endif
}